

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O3

void gai_iterator_init(Integer g_a,Integer *lo,Integer *hi,_iterator_hdl *hdl)

{
  Integer *np;
  global_array_t *pgVar1;
  short sVar2;
  undefined1 auVar3 [16];
  global_array_t *pgVar4;
  int iVar5;
  Integer IVar6;
  Integer *map;
  Integer *proclist;
  int *piVar7;
  long lVar8;
  logical lVar9;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  int iVar19;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  char err_string [256];
  char local_138 [264];
  
  lVar14 = g_a + 1000;
  sVar2 = GA[lVar14].ndim;
  lVar13 = (long)sVar2;
  IVar6 = pnga_pgroup_nnodes((long)GA[lVar14].p_handle);
  hdl->g_a = g_a;
  hdl->count = 0;
  hdl->oversize = 0;
  map = (Integer *)malloc(IVar6 * 0xe00000000 >> 0x1d | 8);
  hdl->map = map;
  proclist = (Integer *)malloc((IVar6 << 0x20) >> 0x1d);
  hdl->proclist = proclist;
  piVar7 = (int *)malloc((IVar6 << 0x20) >> 0x1e);
  hdl->proclistperm = piVar7;
  if (0 < lVar13) {
    lVar8 = 0;
    do {
      hdl->lo[lVar8] = lo[lVar8];
      hdl->hi[lVar8] = hi[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar13 != lVar8);
  }
  pgVar4 = GA;
  if (4 < (uint)GA[lVar14].distr_type) {
    return;
  }
  pgVar1 = GA + lVar14;
  switch(GA[lVar14].distr_type) {
  case 0:
    np = &hdl->nproc;
    lVar9 = pnga_locate_region(g_a,lo,hi,map,proclist,np);
    if (lVar9 == 0) {
      builtin_strncpy(local_138,"cannot locate region: ",0x17);
      strcpy(local_138 + 0x16,GA[lVar14].name);
      sVar10 = strlen(local_138);
      sprintf(local_138 + (int)sVar10," [%ld:%ld ",*lo,*hi);
      sVar10 = strlen(local_138);
      iVar5 = (int)sVar10;
      IVar6 = pnga_ndim(g_a);
      if (1 < IVar6) {
        lVar14 = 1;
        do {
          sprintf(local_138 + (int)sVar10,",%ld:%ld ",lo[lVar14],hi[lVar14]);
          sVar10 = strlen(local_138);
          iVar5 = (int)sVar10;
          lVar14 = lVar14 + 1;
          IVar6 = pnga_ndim(g_a);
        } while (lVar14 < IVar6);
      }
      (local_138 + iVar5)[0] = ']';
      (local_138 + iVar5)[1] = '\0';
      pnga_error(local_138,g_a);
    }
    lVar14 = *np;
    if (lVar14 == 1) {
      *hdl->proclistperm = 0;
      return;
    }
    if (GAnproc < lVar14) {
      pnga_error("permute_proc: error ",lVar14);
    }
    srand((uint)GAme);
    auVar3 = _DAT_001c1660;
    lVar14 = *np;
    if (lVar14 < 1) {
      return;
    }
    piVar7 = hdl->proclistperm;
    lVar13 = lVar14 + -1;
    auVar18._8_4_ = (int)lVar13;
    auVar18._0_8_ = lVar13;
    auVar18._12_4_ = (int)((ulong)lVar13 >> 0x20);
    uVar12 = 0;
    auVar18 = auVar18 ^ _DAT_001c1660;
    auVar20 = _DAT_001c1680;
    do {
      auVar15 = auVar20 ^ auVar3;
      if ((bool)(~(auVar15._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar15._0_4_ ||
                  auVar18._4_4_ < auVar15._4_4_) & 1)) {
        piVar7[uVar12] = (int)uVar12;
      }
      if ((auVar15._12_4_ != auVar18._12_4_ || auVar15._8_4_ <= auVar18._8_4_) &&
          auVar15._12_4_ <= auVar18._12_4_) {
        piVar7[uVar12 + 1] = (int)uVar12 + 1;
      }
      uVar12 = uVar12 + 2;
      lVar13 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 2;
      auVar20._8_8_ = lVar13 + 2;
    } while ((lVar14 + 1U & 0xfffffffffffffffe) != uVar12);
    if (lVar14 < 1) {
      return;
    }
    lVar14 = 0;
    do {
      iVar5 = rand();
      piVar7 = hdl->proclistperm;
      lVar13 = hdl->nproc;
      lVar8 = (long)iVar5 % lVar13;
      iVar5 = piVar7[lVar8];
      piVar7[lVar8] = piVar7[lVar14];
      piVar7[lVar14] = iVar5;
      lVar14 = lVar14 + 1;
    } while (lVar14 < lVar13);
    return;
  case 1:
    hdl->iproc = 0;
    IVar6 = pnga_nodeid();
    hdl->iblock = IVar6;
    return;
  case 2:
    if (0 < sVar2) {
      lVar14 = 0;
      do {
        lVar8 = pgVar4[g_a + 1000].block_dims[lVar14];
        hdl->blk_size[lVar14] = lVar8;
        lVar8 = pgVar4[g_a + 1000].nblock[lVar14] * lVar8;
        hdl->blk_dim[lVar14] = lVar8;
        lVar11 = pgVar4[g_a + 1000].dims[lVar14] / lVar8;
        hdl->blk_num[lVar14] = lVar11;
        lVar8 = pgVar4[g_a + 1000].dims[lVar14] - lVar8 * lVar11;
        hdl->blk_inc[lVar14] = lVar8;
        hdl->blk_ld[lVar14] = lVar11 * pgVar4[g_a + 1000].block_dims[lVar14];
        hdl->hlf_blk[lVar14] = lVar8 / pgVar4[g_a + 1000].block_dims[lVar14];
        lVar14 = lVar14 + 1;
      } while (lVar13 != lVar14);
    }
    hdl->offset = 0;
    hdl->iproc = 0;
    sVar2 = pgVar1->ndim;
    hdl->proc_index[0] = 0;
    auVar20 = _DAT_001c1680;
    auVar3 = _DAT_001c1660;
    if (1 < (long)sVar2) {
      lVar14 = (long)sVar2 + -2;
      auVar16._8_4_ = (int)lVar14;
      auVar16._0_8_ = lVar14;
      auVar16._12_4_ = (int)((ulong)lVar14 >> 0x20);
      uVar12 = 0;
      auVar16 = auVar16 ^ _DAT_001c1660;
      do {
        auVar23._8_4_ = (int)uVar12;
        auVar23._0_8_ = uVar12;
        auVar23._12_4_ = (int)(uVar12 >> 0x20);
        auVar15 = (auVar23 | auVar20) ^ auVar3;
        iVar5 = auVar16._4_4_;
        iVar19 = auVar16._12_4_;
        if ((bool)(~(auVar15._4_4_ == iVar5 && auVar16._0_4_ < auVar15._0_4_ ||
                    iVar5 < auVar15._4_4_) & 1)) {
          hdl->proc_index[uVar12 + 1] = 0;
        }
        if ((auVar15._12_4_ != iVar19 || auVar15._8_4_ <= auVar16._8_4_) && auVar15._12_4_ <= iVar19
           ) {
          hdl->proc_index[uVar12 + 2] = 0;
        }
        uVar12 = uVar12 + 2;
      } while (((int)sVar2 & 0x7ffe) != uVar12);
      hdl->index[0] = 0;
      if (sVar2 < 2) {
        return;
      }
      uVar12 = 0;
      do {
        auVar24._8_4_ = (int)uVar12;
        auVar24._0_8_ = uVar12;
        auVar24._12_4_ = (int)(uVar12 >> 0x20);
        auVar15 = (auVar24 | auVar20) ^ auVar3;
        if ((bool)(~(auVar15._4_4_ == iVar5 && auVar16._0_4_ < auVar15._0_4_ ||
                    iVar5 < auVar15._4_4_) & 1)) {
          hdl->index[uVar12 + 1] = 0;
        }
        if ((auVar15._12_4_ != iVar19 || auVar15._8_4_ <= auVar16._8_4_) && auVar15._12_4_ <= iVar19
           ) {
          hdl->index[uVar12 + 2] = 0;
        }
        uVar12 = uVar12 + 2;
      } while (((int)sVar2 & 0x7ffe) != uVar12);
      return;
    }
    break;
  case 3:
    hdl->offset = 0;
    hdl->iproc = 0;
    if (0 < sVar2) {
      lVar8 = 0;
      do {
        hdl->blk_size[lVar8] = pgVar4[lVar14].block_dims[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar13 != lVar8);
    }
    sVar2 = pgVar1->ndim;
    hdl->proc_index[0] = 0;
    auVar20 = _DAT_001c1680;
    auVar3 = _DAT_001c1660;
    if (1 < (long)sVar2) {
      lVar14 = (long)sVar2 + -2;
      auVar17._8_4_ = (int)lVar14;
      auVar17._0_8_ = lVar14;
      auVar17._12_4_ = (int)((ulong)lVar14 >> 0x20);
      uVar12 = 0;
      auVar17 = auVar17 ^ _DAT_001c1660;
      do {
        auVar25._8_4_ = (int)uVar12;
        auVar25._0_8_ = uVar12;
        auVar25._12_4_ = (int)(uVar12 >> 0x20);
        auVar15 = (auVar25 | auVar20) ^ auVar3;
        iVar5 = auVar17._4_4_;
        iVar19 = auVar17._12_4_;
        if ((bool)(~(auVar15._4_4_ == iVar5 && auVar17._0_4_ < auVar15._0_4_ ||
                    iVar5 < auVar15._4_4_) & 1)) {
          hdl->proc_index[uVar12 + 1] = 0;
        }
        if ((auVar15._12_4_ != iVar19 || auVar15._8_4_ <= auVar17._8_4_) && auVar15._12_4_ <= iVar19
           ) {
          hdl->proc_index[uVar12 + 2] = 0;
        }
        uVar12 = uVar12 + 2;
      } while (((int)sVar2 & 0x7ffe) != uVar12);
      hdl->index[0] = 0;
      if (sVar2 < 2) {
        return;
      }
      uVar12 = 0;
      do {
        auVar26._8_4_ = (int)uVar12;
        auVar26._0_8_ = uVar12;
        auVar26._12_4_ = (int)(uVar12 >> 0x20);
        auVar15 = (auVar26 | auVar20) ^ auVar3;
        if ((bool)(~(auVar15._4_4_ == iVar5 && auVar17._0_4_ < auVar15._0_4_ ||
                    iVar5 < auVar15._4_4_) & 1)) {
          hdl->index[uVar12 + 1] = 0;
        }
        if ((auVar15._12_4_ != iVar19 || auVar15._8_4_ <= auVar17._8_4_) && auVar15._12_4_ <= iVar19
           ) {
          hdl->index[uVar12 + 2] = 0;
        }
        uVar12 = uVar12 + 2;
      } while (((int)sVar2 & 0x7ffe) != uVar12);
      return;
    }
    break;
  case 4:
    hdl->offset = 0;
    hdl->iproc = 0;
    hdl->mapc = pgVar4[lVar14].mapc;
    sVar2 = pgVar1->ndim;
    hdl->proc_index[0] = 0;
    auVar20 = _DAT_001c1680;
    auVar3 = _DAT_001c1660;
    if (1 < (long)sVar2) {
      lVar14 = (long)sVar2 + -2;
      auVar15._8_4_ = (int)lVar14;
      auVar15._0_8_ = lVar14;
      auVar15._12_4_ = (int)((ulong)lVar14 >> 0x20);
      uVar12 = 0;
      auVar15 = auVar15 ^ _DAT_001c1660;
      do {
        auVar21._8_4_ = (int)uVar12;
        auVar21._0_8_ = uVar12;
        auVar21._12_4_ = (int)(uVar12 >> 0x20);
        auVar21 = (auVar21 | auVar20) ^ auVar3;
        iVar5 = auVar15._4_4_;
        iVar19 = auVar15._12_4_;
        if ((bool)(~(auVar21._4_4_ == iVar5 && auVar15._0_4_ < auVar21._0_4_ ||
                    iVar5 < auVar21._4_4_) & 1)) {
          hdl->proc_index[uVar12 + 1] = 0;
        }
        if ((auVar21._12_4_ != iVar19 || auVar21._8_4_ <= auVar15._8_4_) && auVar21._12_4_ <= iVar19
           ) {
          hdl->proc_index[uVar12 + 2] = 0;
        }
        uVar12 = uVar12 + 2;
      } while (((int)sVar2 & 0x7ffe) != uVar12);
      hdl->index[0] = 0;
      if (sVar2 < 2) {
        return;
      }
      uVar12 = 0;
      do {
        auVar22._8_4_ = (int)uVar12;
        auVar22._0_8_ = uVar12;
        auVar22._12_4_ = (int)(uVar12 >> 0x20);
        auVar21 = (auVar22 | auVar20) ^ auVar3;
        if ((bool)(~(auVar21._4_4_ == iVar5 && auVar15._0_4_ < auVar21._0_4_ ||
                    iVar5 < auVar21._4_4_) & 1)) {
          hdl->index[uVar12 + 1] = 0;
        }
        if ((auVar21._12_4_ != iVar19 || auVar21._8_4_ <= auVar15._8_4_) && auVar21._12_4_ <= iVar19
           ) {
          hdl->index[uVar12 + 2] = 0;
        }
        uVar12 = uVar12 + 2;
      } while (((int)sVar2 & 0x7ffe) != uVar12);
      return;
    }
  }
  hdl->index[0] = 0;
  return;
}

Assistant:

void gai_iterator_init(Integer g_a, Integer lo[], Integer hi[],
                       _iterator_hdl *hdl)
{
  Integer handle = GA_OFFSET + g_a;
  Integer ndim = GA[handle].ndim;
  int grp = GA[handle].p_handle;
  int nproc = pnga_pgroup_nnodes(grp);
  Integer i;
  hdl->g_a = g_a;
  hdl->count = 0;
  hdl->oversize = 0;
  hdl->map = malloc((size_t)(nproc*2*MAXDIM+1)*sizeof(Integer));
  hdl->proclist = malloc(nproc*sizeof(Integer));;
  hdl->proclistperm = malloc(nproc*sizeof(int));
  for (i=0; i<ndim; i++) {
    hdl->lo[i] = lo[i];
    hdl->hi[i] = hi[i];
  }
  /* Standard GA distribution */
  if (GA[handle].distr_type == REGULAR) {
    /* Locate the processors containing some portion of the patch
     * specified by lo and hi and return the results in hdl->map,
     * hdl->proclist, and np. hdl->proclist contains a list of processors
     * containing some portion of the patch, hdl->map contains
     * the lower and upper indices of the portion of the patch held
     * by a given processor, and np contains the total number of
     * processors that contain some portion of the patch.
     */
    if(!pnga_locate_region(g_a, lo, hi, hdl->map, hdl->proclist, &hdl->nproc ))
      ga_RegionError(pnga_ndim(g_a), lo, hi, g_a);

    gaPermuteProcList(hdl->nproc, hdl->proclistperm);

    /* Block-cyclic distribution */
  } else if (GA[handle].distr_type == BLOCK_CYCLIC) {
    /* GA uses simple block cyclic data distribution */
    hdl->iproc = 0;
    hdl->iblock = pnga_nodeid();
  } else if (GA[handle].distr_type == SCALAPACK)  {
    /* GA uses ScaLAPACK block cyclic data distribution */
    int j;
    C_Integer *block_dims;
    /* Scalapack-type block-cyclic data distribution */
    /* Calculate some properties associated with data distribution */
    int *proc_grid = GA[handle].nblock;
    /*num_blocks = GA[handle].num_blocks;*/
    block_dims = GA[handle].block_dims;
    /* blk_dim: length of one repeat unit
     * blk_num: number of repeat units
     * blk_inc: number of elements in last incomplete repeat unit
     * blk_ld: length of complete blocks in repeat unit. Does not
     *         account for partial block at end
     * hlf_blk: number of full blocks in partial repeat unit
     */
    for (j=0; j<ndim; j++)  {
      hdl->blk_size[j] = block_dims[j];
      hdl->blk_dim[j] = block_dims[j]*proc_grid[j];
      hdl->blk_num[j] = GA[handle].dims[j]/hdl->blk_dim[j];
      hdl->blk_inc[j] = GA[handle].dims[j]-hdl->blk_num[j]*hdl->blk_dim[j];
      hdl->blk_ld[j] = hdl->blk_num[j]*block_dims[j];
      hdl->hlf_blk[j] = hdl->blk_inc[j]/block_dims[j];
    }
    hdl->iproc = 0;
    hdl->offset = 0;
    /* Initialize proc_index and index arrays */
    gam_find_proc_indices(handle, hdl->iproc, hdl->proc_index);
    gam_find_proc_indices(handle, hdl->iproc, hdl->index);
  } else if (GA[handle].distr_type == TILED)  {
    int j;
    C_Integer *block_dims;
    hdl->iproc = 0;
    hdl->offset = 0;
    block_dims = GA[handle].block_dims;
    for (j=0; j<ndim; j++)  {
      hdl->blk_size[j] = block_dims[j];
    }
    /* Initialize proc_index and index arrays */
    gam_find_tile_proc_indices(handle, hdl->iproc, hdl->proc_index);
    gam_find_tile_proc_indices(handle, hdl->iproc, hdl->index);
  } else if (GA[handle].distr_type == TILED_IRREG)  {
    int j;
    hdl->iproc = 0;
    hdl->offset = 0;
    hdl->mapc =  GA[handle].mapc;
    /* Initialize proc_index and index arrays */
    gam_find_tile_proc_indices(handle, hdl->iproc, hdl->proc_index);
    gam_find_tile_proc_indices(handle, hdl->iproc, hdl->index);
  }
}